

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Networking.h
# Opt level: O0

int uS::TLS::Context::passwordCallback(char *buf,int size,int rwflag,void *u)

{
  void *__dest;
  int *piVar1;
  void *__src;
  void *in_RDI;
  int length;
  string *password;
  int local_28;
  int local_24;
  int local_c;
  void *local_8;
  
  local_8 = in_RDI;
  local_28 = std::__cxx11::string::length();
  piVar1 = std::min<int>(&local_c,&local_28);
  __dest = local_8;
  local_24 = *piVar1;
  __src = (void *)std::__cxx11::string::data();
  memcpy(__dest,__src,(long)local_24);
  *(undefined1 *)((long)local_8 + (long)local_24) = 0;
  return local_24;
}

Assistant:

static int passwordCallback(char *buf, int size, int rwflag, void *u)
    {
        std::string *password = (std::string *) u;
        int length = std::min<int>(size, password->length());
        memcpy(buf, password->data(), length);
        buf[length] = '\0';
        return length;
    }